

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManFlowUpdateCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  
  Aig_ManIncrementTravId(p);
  if (0 < vMinCut->nSize) {
    lVar7 = 0;
    do {
      Llb_ManFlowLabelTfi_rec(p,(Aig_Obj_t *)vMinCut->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMinCut->nSize);
  }
  vMinCut->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar7 = 0;
    do {
      pvVar5 = pVVar2->pArray[lVar7];
      if ((pvVar5 != (void *)0x0) &&
         ((uVar1 = (uint)*(undefined8 *)((long)pvVar5 + 0x18), (uVar1 & 7) == 3 ||
          (0xfffffffd < (uVar1 & 7) - 7)))) {
        iVar4 = p->nTravIds;
        if ((*(int *)((long)pvVar5 + 0x20) != iVar4) &&
           (*(int *)((long)pvVar5 + 0x20) != iVar4 + -1)) {
          pvVar6 = (void *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
          if (*(int *)((long)pvVar6 + 0x20) == iVar4 + -1) {
            *(int *)((long)pvVar6 + 0x20) = iVar4;
            uVar1 = vMinCut->nCap;
            if (vMinCut->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vMinCut->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(0x80);
                }
                else {
                  ppvVar3 = (void **)realloc(vMinCut->pArray,0x80);
                }
                vMinCut->pArray = ppvVar3;
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar1 * 2;
                if (iVar4 <= (int)uVar1) goto LAB_00822af0;
                if (vMinCut->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar3 = (void **)realloc(vMinCut->pArray,(ulong)uVar1 << 4);
                }
                vMinCut->pArray = ppvVar3;
              }
              vMinCut->nCap = iVar4;
            }
LAB_00822af0:
            iVar4 = vMinCut->nSize;
            vMinCut->nSize = iVar4 + 1;
            vMinCut->pArray[iVar4] = pvVar6;
          }
          if (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7) {
            pvVar5 = (void *)(*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe);
            if (*(int *)((long)pvVar5 + 0x20) == p->nTravIds + -1) {
              *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
              uVar1 = vMinCut->nCap;
              if (vMinCut->nSize == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (vMinCut->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vMinCut->pArray,0x80);
                  }
                  vMinCut->pArray = ppvVar3;
                  iVar4 = 0x10;
                }
                else {
                  iVar4 = uVar1 * 2;
                  if (iVar4 <= (int)uVar1) goto LAB_00822ba4;
                  if (vMinCut->pArray == (void **)0x0) {
                    ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar3 = (void **)realloc(vMinCut->pArray,(ulong)uVar1 << 4);
                  }
                  vMinCut->pArray = ppvVar3;
                }
                vMinCut->nCap = iVar4;
              }
LAB_00822ba4:
              iVar4 = vMinCut->nSize;
              vMinCut->nSize = iVar4 + 1;
              vMinCut->pArray[iVar4] = pvVar5;
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar2 = p->vObjs;
    } while (lVar7 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Llb_ManFlowUpdateCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // label the TFI of the cut nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Llb_ManFlowLabelTfi_rec( p, pObj );
    // collect labeled fanins of non-labeled nodes
    Vec_PtrClear( vMinCut );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCo(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) || Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin0(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin0(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin0(pObj) );
        }
        if ( Aig_ObjIsNode(pObj) && Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin1(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin1(pObj) );
        }
    }
}